

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O2

void kv_get_nth_idx_test(btree_kv_ops *kv_ops)

{
  bnode *__ptr;
  char *__format;
  idx_t location;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  __ptr = dummy_node('\0','\0',0);
  __ptr->nentry = 4;
  (*kv_ops->get_nth_idx)(__ptr,3,4,&location);
  if (location != 3) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x2cb);
    kv_get_nth_idx_test(btree_kv_ops*)::__test_pass = '\x01';
    if (location != 3) {
      __assert_fail("location == 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x2cb,"void kv_get_nth_idx_test(btree_kv_ops *)");
    }
  }
  (*kv_ops->get_nth_idx)(__ptr,1,4,&location);
  if (location != 1) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x2d1);
    kv_get_nth_idx_test(btree_kv_ops*)::__test_pass = '\x01';
    if (location != 1) {
      __assert_fail("location == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x2d1,"void kv_get_nth_idx_test(btree_kv_ops *)");
    }
  }
  (*kv_ops->get_nth_idx)(__ptr,0,3,&location);
  if (location != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x2d7);
    kv_get_nth_idx_test(btree_kv_ops*)::__test_pass = '\x01';
    if (location != 0) {
      __assert_fail("location == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x2d7,"void kv_get_nth_idx_test(btree_kv_ops *)");
    }
  }
  free(__ptr);
  memleak_end();
  __format = "%s PASSED\n";
  if (kv_get_nth_idx_test(btree_kv_ops*)::__test_pass != '\0') {
    __format = "%s FAILED\n";
  }
  fprintf(_stderr,__format,"kv_get_nth_idx_test");
  return;
}

Assistant:

void kv_get_nth_idx_test(btree_kv_ops *kv_ops)
{

    TEST_INIT();
    memleak_start();

    bnoderef node;
    idx_t num, den, location;

    node = dummy_node(0, 0, 0);
    node->nentry = 4;
    num = 3;
    den = 4;

    // verify 3/4th offset
    kv_ops->get_nth_idx(node, num, den, &location);
    TEST_CHK(location == 3);

    // verify 1/4 offset
    num = 1;
    den = 4;
    kv_ops->get_nth_idx(node, num, den, &location);
    TEST_CHK(location == 1);

     // verify with num == 0
    num = 0;
    den = 3;
    kv_ops->get_nth_idx(node, num, den, &location);
    TEST_CHK(location == 0);

    free(node);
    memleak_end();
    TEST_RESULT("kv_get_nth_idx_test");
}